

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRStereoNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRStereoNode::VRStereoNode
          (VRStereoNode *this,string *name,float interOcularDist,VRGraphicsToolkit *gfxToolkit,
          VRStereoFormat format)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  value_type *in_stack_fffffffffffffef8;
  value_type *__x;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *in_stack_ffffffffffffff08;
  VRDisplayNode *in_stack_ffffffffffffff10;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string *in_stack_ffffffffffffff38;
  VRDisplayNode *in_stack_ffffffffffffff40;
  undefined1 local_a9 [40];
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [36];
  undefined4 local_24;
  undefined8 local_20;
  undefined4 local_14;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_XMM0_Da;
  VRDisplayNode::VRDisplayNode(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  *in_RDI = &PTR__VRStereoNode_001bd888;
  in_RDI[0xe] = local_20;
  *(undefined4 *)(in_RDI + 0xf) = local_24;
  *(undefined4 *)((long)in_RDI + 0x7c) = local_14;
  __a = &local_49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
             ,__a);
  VRDisplayNode::_addValueNeeded
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(bool)in_stack_ffffffffffffff37);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
             ,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  __x = (value_type *)(in_RDI + 8);
  this_00 = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
             ,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,__x);
  std::__cxx11::string::~string((string *)(local_a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff28
             ,__a);
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,__x);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  return;
}

Assistant:

VRStereoNode::VRStereoNode(const std::string &name, float interOcularDist, VRGraphicsToolkit *gfxToolkit, VRStereoFormat format) :
  VRDisplayNode(name), _gfxToolkit(gfxToolkit), _format(format), _iod(interOcularDist) {

  // in:
  _addValueNeeded("HeadMatrix");

  // out:
  _valuesAdded.push_back("CameraMatrix");
  _valuesAdded.push_back("Eye");
  _valuesAdded.push_back("StereoFormat");

  // There are also some conditional requirements such as "ViewportX" that we
  // only need under some conditions.  These are checked for below.
}